

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

int __thiscall NodeSet::get_index(NodeSet *this,vector<int,_std::allocator<int>_> *lbl)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  int iVar3;
  
  cVar1 = std::
          _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::find((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  *)this,lbl);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->index)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = (int)((ulong)((long)(this->labels).
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->labels).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->labels,lbl);
    pmVar2 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    *pmVar2 = iVar3;
  }
  else {
    pmVar2 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    iVar3 = *pmVar2;
  }
  return iVar3;
}

Assistant:

int NodeSet::get_index(const std::vector<int> &lbl) {
	if (index.count(lbl)) {
		return index[lbl];
	} else {
		int ind = labels.size();
		labels.push_back(lbl);
		index[lbl] = ind;
		return ind;
	}
}